

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printPCRelImm(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  ulong local_30;
  int64_t imm;
  MCOperand *Op;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var2 = MCOperand_isImm(op);
  if (_Var2) {
    iVar3 = MCOperand_getImm(op);
    local_30 = iVar3 + (ulong)MI->flat_insn->size + MI->address;
    if (MI->csh->mode != CS_MODE_64) {
      local_30 = local_30 & 0xffffffff;
    }
    if (((MI->csh->mode == CS_MODE_16) && (MI->Opcode != 0x44f)) && (MI->Opcode != 0x163)) {
      local_30 = local_30 & 0xffff;
    }
    if (((MI->csh->mode == CS_MODE_16) && (MI->Opcode == 0x44f)) && (MI->x86_prefix[2] != 'f')) {
      local_30 = local_30 & 0xffff;
    }
    if ((MI->Opcode == 0x162) || (MI->Opcode == 0x44e)) {
      local_30 = local_30 & 0xffff;
    }
    if ((long)local_30 < 0) {
      SStream_concat(O,"0x%lx",local_30);
    }
    else if ((long)local_30 < 10) {
      SStream_concat(O,"%lu",local_30);
    }
    else {
      SStream_concat(O,"0x%lx",local_30);
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar4 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
      puVar4[0] = '\x02';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      if ((MI->flat_insn->detail->field_6).x86.op_count == '\0') {
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->imm_size;
      }
      else {
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] =
             *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50);
      }
      *(ulong *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = local_30;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
    }
    if (MI->op1_size == '\0') {
      MI->op1_size = MI->imm_size;
    }
  }
  return;
}

Assistant:

static void printPCRelImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op) + MI->flat_insn->size + MI->address;

		// truncat imm for non-64bit
		if (MI->csh->mode != CS_MODE_64) {
			imm = imm & 0xffffffff;
		}

		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode != X86_JMP_4 && MI->Opcode != X86_CALLpcrel32))
			imm = imm & 0xffff;

		// Hack: X86 16bit with opcode X86_JMP_4
		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode == X86_JMP_4 && MI->x86_prefix[2] != 0x66))
			imm = imm & 0xffff;

		// CALL/JMP rel16 is special
		if (MI->Opcode == X86_CALLpcrel16 || MI->Opcode == X86_JMP_2)
			imm = imm & 0xffff;

		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, imm);
		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
			// if op_count > 0, then this operand's size is taken from the destination op
			if (MI->flat_insn->detail->x86.op_count > 0)
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->flat_insn->detail->x86.operands[0].size;
			else
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
			MI->flat_insn->detail->x86.op_count++;
		}

		if (MI->op1_size == 0)
			MI->op1_size = MI->imm_size;
	}
}